

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::Generators::Generators<pair<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>::
next(Generators<pair<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_> *this)

{
  pointer pGVar1;
  char cVar2;
  ulong uVar3;
  
  pGVar1 = (this->m_generators).
           super__Vector_base<Catch::Generators::GeneratorWrapper<pair<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>,_std::allocator<Catch::Generators::GeneratorWrapper<pair<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this->m_current <
      (ulong)((long)(this->m_generators).
                    super__Vector_base<Catch::Generators::GeneratorWrapper<pair<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>,_std::allocator<Catch::Generators::GeneratorWrapper<pair<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1 >> 3)) {
    cVar2 = (**(code **)(*(long *)pGVar1[this->m_current].m_generator._M_t.
                                  super___uniq_ptr_impl<Catch::Generators::IGenerator<pair<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<pair<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>_>_>
                        + 0x10))();
    uVar3 = this->m_current;
    if (cVar2 == '\0') {
      uVar3 = uVar3 + 1;
      this->m_current = uVar3;
    }
    return uVar3 < (ulong)((long)(this->m_generators).
                                 super__Vector_base<Catch::Generators::GeneratorWrapper<pair<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>,_std::allocator<Catch::Generators::GeneratorWrapper<pair<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_generators).
                                 super__Vector_base<Catch::Generators::GeneratorWrapper<pair<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>,_std::allocator<Catch::Generators::GeneratorWrapper<pair<trng::optimized_impl::uint128,_trng::optimized_impl::uint128>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
  }
  return false;
}

Assistant:

bool next() override {
            if (m_current >= m_generators.size()) {
                return false;
            }
            const bool current_status = m_generators[m_current].next();
            if (!current_status) {
                ++m_current;
            }
            return m_current < m_generators.size();
        }